

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

void VW::start_parser(vw *all)

{
  thread *in_RDI;
  vw **in_stack_00000020;
  _func_void_vw_ptr *in_stack_00000028;
  thread *in_stack_00000030;
  thread *in_stack_fffffffffffffff0;
  
  std::thread::thread<void(&)(vw*),vw*,void>(in_stack_00000030,in_stack_00000028,in_stack_00000020);
  std::thread::operator=(in_stack_fffffffffffffff0,in_RDI);
  std::thread::~thread((thread *)0x333843);
  return;
}

Assistant:

void start_parser(vw& all) { all.parse_thread = std::thread(main_parse_loop, &all); }